

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.cpp
# Opt level: O1

void __thiscall CGameControllerCTF::Tick(CGameControllerCTF *this)

{
  int *piVar1;
  uint uVar2;
  CGameContext *pCVar3;
  CFlag *this_00;
  CFlag *pCVar4;
  CEntity *pCVar5;
  CCharacter *pCVar6;
  IServer *pIVar7;
  IConsole *pIVar8;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  bool bVar15;
  float fVar16;
  float fVar17;
  char aBuf_1 [256];
  char aBuf [64];
  char local_338 [256];
  CEntity *local_238 [64];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  IGameController::Tick(&this->super_IGameController);
  pCVar3 = (this->super_IGameController).m_pGameServer;
  if (((pCVar3->m_World).m_ResetRequested == false) && ((pCVar3->m_World).m_Paused == false)) {
    bVar13 = false;
    uVar11 = 0;
    do {
      this_00 = this->m_apFlags[uVar11];
      if (this_00 == (CFlag *)0x0) {
        uVar10 = 0;
      }
      else if (this_00->m_pCarrier == (CCharacter *)0x0) {
        uVar10 = CGameWorld::FindEntities
                           (&((this->super_IGameController).m_pGameServer)->m_World,
                            (this_00->super_CEntity).m_Pos,14.0,local_238,0x40,3);
        if (0 < (int)uVar10) {
          uVar14 = 0;
          do {
            pCVar5 = local_238[uVar14];
            if (((*(char *)&pCVar5[1].m_pGameWorld == '\x01') &&
                (*(int *)(pCVar5[1]._vptr_CEntity + 0x81) != -1)) &&
               (iVar9 = CCollision::IntersectLine
                                  (&((this->super_IGameController).m_pGameServer)->m_Collision,
                                   (this_00->super_CEntity).m_Pos,pCVar5->m_Pos,(vec2 *)0x0,
                                   (vec2 *)0x0), iVar9 == 0)) {
              pCVar6 = (CCharacter *)local_238[uVar14];
              if (pCVar6->m_pPlayer->m_Team != this_00->m_Team) {
                if (this_00->m_AtStand == true) {
                  piVar1 = (this->super_IGameController).m_aTeamscore + (uVar11 & 0xffffffff ^ 1);
                  *piVar1 = *piVar1 + 1;
                }
                CFlag::Grab(this_00,pCVar6);
                piVar1 = &this_00->m_pCarrier->m_pPlayer->m_Score;
                *piVar1 = *piVar1 + 1;
                uVar10 = this_00->m_pCarrier->m_pPlayer->m_ClientID;
                pIVar7 = (this->super_IGameController).m_pServer;
                iVar9 = (*(pIVar7->super_IInterface)._vptr_IInterface[2])(pIVar7,(ulong)uVar10);
                str_format(local_338,0x100,"flag_grab player=\'%d:%s\' team=%d",(ulong)uVar10,
                           CONCAT44(extraout_var_01,iVar9),
                           (ulong)(uint)this_00->m_pCarrier->m_pPlayer->m_Team);
                pIVar8 = ((this->super_IGameController).m_pGameServer)->m_pConsole;
                (*(pIVar8->super_IInterface)._vptr_IInterface[0x19])(pIVar8,2,"game",local_338,0);
                CGameContext::SendGameMsg
                          ((this->super_IGameController).m_pGameServer,8,(int)uVar11,-1);
                break;
              }
              if (this_00->m_AtStand == false) {
                piVar1 = &pCVar6->m_pPlayer->m_Score;
                *piVar1 = *piVar1 + 1;
                uVar2 = pCVar6->m_pPlayer->m_ClientID;
                pIVar7 = (this->super_IGameController).m_pServer;
                iVar9 = (*(pIVar7->super_IInterface)._vptr_IInterface[2])(pIVar7,(ulong)uVar2);
                str_format(local_338,0x100,"flag_return player=\'%d:%s\' team=%d",(ulong)uVar2,
                           CONCAT44(extraout_var,iVar9),(ulong)(uint)pCVar6->m_pPlayer->m_Team);
                pIVar8 = ((this->super_IGameController).m_pGameServer)->m_pConsole;
                (*(pIVar8->super_IInterface)._vptr_IInterface[0x19])(pIVar8,2,"game",local_338,0);
                CGameContext::SendGameMsg((this->super_IGameController).m_pGameServer,5,-1);
                (*(this_00->super_CEntity)._vptr_CEntity[3])(this_00);
              }
            }
            uVar14 = uVar14 + 1;
          } while (uVar10 != uVar14);
        }
        uVar10 = 0;
      }
      else {
        uVar14 = uVar11 & 0xffffffff ^ 1;
        pCVar4 = this->m_apFlags[uVar14];
        uVar10 = 0;
        if ((pCVar4 != (CFlag *)0x0) && (pCVar4->m_AtStand == true)) {
          fVar16 = (this_00->super_CEntity).m_Pos.field_0.x -
                   (pCVar4->super_CEntity).m_Pos.field_0.x;
          fVar17 = (this_00->super_CEntity).m_Pos.field_1.y -
                   (pCVar4->super_CEntity).m_Pos.field_1.y;
          fVar16 = fVar16 * fVar16 + fVar17 * fVar17;
          if (fVar16 < 0.0) {
            fVar16 = sqrtf(fVar16);
          }
          else {
            fVar16 = SQRT(fVar16);
          }
          if (fVar16 < 42.0) {
            piVar1 = (this->super_IGameController).m_aTeamscore + uVar14;
            *piVar1 = *piVar1 + 100;
            pCVar6 = this_00->m_pCarrier;
            piVar1 = &pCVar6->m_pPlayer->m_Score;
            *piVar1 = *piVar1 + 5;
            pIVar7 = (this->super_IGameController).m_pServer;
            fVar16 = (float)(pIVar7->m_CurrentGameTick - this_00->m_GrabTick);
            uVar10 = pCVar6->m_pPlayer->m_ClientID;
            iVar9 = (*(pIVar7->super_IInterface)._vptr_IInterface[2])(pIVar7,(ulong)uVar10);
            str_format((char *)local_238,0x40,"flag_capture player=\'%d:%s\' team=%d time=%.2f",
                       (double)(fVar16 / (float)((this->super_IGameController).m_pServer)->
                                                m_TickSpeed),(ulong)uVar10,
                       CONCAT44(extraout_var_00,iVar9),
                       (ulong)(uint)this_00->m_pCarrier->m_pPlayer->m_Team);
            pIVar8 = ((this->super_IGameController).m_pGameServer)->m_pConsole;
            (*(pIVar8->super_IInterface)._vptr_IInterface[0x19])(pIVar8,2,"game",local_238,0);
            CGameContext::SendGameMsg
                      ((this->super_IGameController).m_pGameServer,9,(int)uVar11,
                       this_00->m_pCarrier->m_pPlayer->m_ClientID,(int)fVar16,-1);
            lVar12 = 0xdf;
            do {
              (**(code **)(**(long **)((this->super_IGameController).m_aTeamSize + lVar12 * 2 + -8)
                          + 0x18))();
              lVar12 = lVar12 + 1;
            } while (lVar12 == 0xe0);
            uVar10 = (*(this->super_IGameController)._vptr_IGameController[1])(this);
            uVar10 = uVar10 & 0xff;
          }
        }
      }
      if ((uVar10 & 3) != 0) {
        if (!bVar13) goto LAB_001229f7;
        break;
      }
      bVar15 = uVar11 == 0;
      bVar13 = !bVar15;
      uVar11 = uVar11 + 1;
    } while (bVar15);
    (*(this->super_IGameController)._vptr_IGameController[1])(this);
  }
LAB_001229f7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameControllerCTF::Tick()
{
	IGameController::Tick();

	if(GameServer()->m_World.m_ResetRequested || GameServer()->m_World.m_Paused)
		return;

	for(int fi = 0; fi < 2; fi++)
	{
		CFlag *F = m_apFlags[fi];

		if(!F)
			continue;

		//
		if(F->GetCarrier())
		{
			if(m_apFlags[fi^1] && m_apFlags[fi^1]->IsAtStand())
			{
				if(distance(F->GetPos(), m_apFlags[fi^1]->GetPos()) < CFlag::ms_PhysSize + CCharacter::ms_PhysSize)
				{
					// CAPTURE! \o/
					m_aTeamscore[fi^1] += 100;
					F->GetCarrier()->GetPlayer()->m_Score += 5;
					float Diff = Server()->Tick() - F->GetGrabTick();

					char aBuf[64];
					str_format(aBuf, sizeof(aBuf), "flag_capture player='%d:%s' team=%d time=%.2f",
						F->GetCarrier()->GetPlayer()->GetCID(),
						Server()->ClientName(F->GetCarrier()->GetPlayer()->GetCID()),
						F->GetCarrier()->GetPlayer()->GetTeam(),
						Diff / (float)Server()->TickSpeed()
					);
					GameServer()->Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "game", aBuf);

					GameServer()->SendGameMsg(GAMEMSG_CTF_CAPTURE, fi, F->GetCarrier()->GetPlayer()->GetCID(), Diff, -1);
					for(int i = 0; i < 2; i++)
						m_apFlags[i]->Reset();
					// do a win check(capture could trigger win condition)
					if(DoWincheckMatch())
						return;
				}
			}
		}
		else
		{
			CCharacter *apCloseCCharacters[MAX_CLIENTS];
			int Num = GameServer()->m_World.FindEntities(F->GetPos(), CFlag::ms_PhysSize, (CEntity**)apCloseCCharacters, MAX_CLIENTS, CGameWorld::ENTTYPE_CHARACTER);
			for(int i = 0; i < Num; i++)
			{
				if(!apCloseCCharacters[i]->IsAlive() || apCloseCCharacters[i]->GetPlayer()->GetTeam() == TEAM_SPECTATORS || GameServer()->Collision()->IntersectLine(F->GetPos(), apCloseCCharacters[i]->GetPos(), NULL, NULL))
					continue;

				if(apCloseCCharacters[i]->GetPlayer()->GetTeam() == F->GetTeam())
				{
					// return the flag
					if(!F->IsAtStand())
					{
						CCharacter *pChr = apCloseCCharacters[i];
						pChr->GetPlayer()->m_Score += 1;

						char aBuf[256];
						str_format(aBuf, sizeof(aBuf), "flag_return player='%d:%s' team=%d",
							pChr->GetPlayer()->GetCID(),
							Server()->ClientName(pChr->GetPlayer()->GetCID()),
							pChr->GetPlayer()->GetTeam()
						);
						GameServer()->Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "game", aBuf);
						GameServer()->SendGameMsg(GAMEMSG_CTF_RETURN, -1);
						F->Reset();
					}
				}
				else
				{
					// take the flag
					if(F->IsAtStand())
						m_aTeamscore[fi^1]++;

					F->Grab(apCloseCCharacters[i]);

					F->GetCarrier()->GetPlayer()->m_Score += 1;

					char aBuf[256];
					str_format(aBuf, sizeof(aBuf), "flag_grab player='%d:%s' team=%d",
						F->GetCarrier()->GetPlayer()->GetCID(),
						Server()->ClientName(F->GetCarrier()->GetPlayer()->GetCID()),
						F->GetCarrier()->GetPlayer()->GetTeam()
					);
					GameServer()->Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "game", aBuf);
					GameServer()->SendGameMsg(GAMEMSG_CTF_GRAB, fi, -1);
					break;
				}
			}
		}
	}
	// do a win check(grabbing flags could trigger win condition)
	DoWincheckMatch();
}